

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_context_output(jx9_context *pCtx,char *zString,int nLen)

{
  jx9_vm *pjVar1;
  int iVar2;
  
  if (nLen < 0) {
    nLen = SyStrlen(zString);
  }
  if (nLen == 0) {
    iVar2 = 0;
  }
  else {
    pjVar1 = pCtx->pVm;
    iVar2 = (*(pjVar1->sVmConsumer).xConsumer)(zString,nLen,(pjVar1->sVmConsumer).pUserData);
    pjVar1->nOutputLen = pjVar1->nOutputLen + nLen;
  }
  return iVar2;
}

Assistant:

JX9_PRIVATE int jx9_context_output(jx9_context *pCtx, const char *zString, int nLen)
{
	SyString sData;
	int rc;
	if( nLen < 0 ){
		nLen = (int)SyStrlen(zString);
	}
	SyStringInitFromBuf(&sData, zString, nLen);
	rc = jx9VmOutputConsume(pCtx->pVm, &sData);
	return rc;
}